

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

QList<QSslCipher> * QSslSocketPrivate::supportedCiphers(void)

{
  Type *pTVar1;
  QArrayDataPointer<QSslCipher> *in_RDI;
  QArrayDataPointer<QSslCipher> *this;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *this_00;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
            local_28;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  ensureInitialized();
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)this);
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,&pTVar1->mutex);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()(this_00);
  QArrayDataPointer<QSslCipher>::QArrayDataPointer(in_RDI,&(pTVar1->supportedCiphers).d);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QList<QSslCipher> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslCipher> QSslSocketPrivate::supportedCiphers()
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);
    return globalData()->supportedCiphers;
}